

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

int Bac_NtkDeriveFromPtr(Bac_Ntk_t *pNtk,Vec_Ptr_t *vNtk,Vec_Int_t *vMap,Vec_Int_t *vBox2Id)

{
  Vec_Int_t *pVVar1;
  void **ppvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  Bac_Man_t *pBVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint i;
  int iVar12;
  Bac_Ntk_t *pBVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  Bac_ObjType_t Type;
  long lVar21;
  
  iVar8 = vNtk->nSize;
  if ((((iVar8 < 1) || (iVar8 == 1)) || (iVar8 < 3)) || (iVar8 < 5)) {
LAB_003bcde2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar2 = vNtk->pArray;
  pcVar14 = (char *)*ppvVar2;
  pvVar3 = ppvVar2[1];
  pvVar4 = ppvVar2[2];
  pvVar5 = ppvVar2[4];
  iVar8 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar14,(int *)0x0);
  if (pNtk->NameId != iVar8) {
    pcVar20 = "Bac_NtkNameId(pNtk) == NameId";
    pcVar19 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c";
    pcVar14 = "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)";
LAB_003bce35:
    __assert_fail(pcVar20,pcVar19,0x11d,pcVar14);
  }
  if (0 < *(int *)((long)pvVar3 + 4)) {
    pVVar1 = &pNtk->vInfo;
    lVar21 = 0;
    do {
      pcVar19 = *(char **)(*(long *)((long)pvVar3 + 8) + lVar21 * 8);
      uVar9 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar19,(int *)0x0);
      Vec_IntFillExtra(vMap,uVar9 + 1,-1);
      if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) goto LAB_003bcd85;
      if (vMap->pArray[uVar9] != -1) {
        pcVar20 = "PI with name \"%s\" is not unique module \"%s\".\n";
LAB_003bcd68:
        printf(pcVar20,pcVar19,pcVar14);
        return 0;
      }
      uVar10 = Bac_ObjAlloc(pNtk,BAC_OBJ_PI,-1);
      iVar8 = Bac_ObjName(pNtk,uVar10);
      if (iVar8 != 0) goto LAB_003bce3f;
      if (((int)uVar10 < 0) || ((pNtk->vType).nSize <= (int)uVar10)) goto LAB_003bcda4;
      if (((pNtk->vType).pArray[uVar10] & 0xfcU) == 4) goto LAB_003bce3f;
      Vec_IntFillExtra(&pNtk->vName,uVar10 + 1,0);
      if ((pNtk->vName).nSize <= (int)uVar10) goto LAB_003bcdc3;
      (pNtk->vName).pArray[uVar10] = uVar9 * 4;
      Vec_IntFillExtra(vMap,uVar9 + 1,-1);
      if (vMap->nSize <= (int)uVar9) goto LAB_003bcdc3;
      vMap->pArray[uVar9] = uVar10;
      Vec_IntPush(pVVar1,uVar9 * 4 | 1);
      Vec_IntPush(pVVar1,-1);
      Vec_IntPush(pVVar1,-1);
      lVar21 = lVar21 + 1;
    } while (lVar21 < *(int *)((long)pvVar3 + 4));
  }
  vBox2Id->nSize = 0;
  iVar8 = *(int *)((long)pvVar5 + 4);
  if (0 < iVar8) {
    lVar21 = 0;
    do {
      lVar18 = *(long *)(*(long *)((long)pvVar5 + 8) + lVar21 * 8);
      if ((*(int *)(lVar18 + 4) < 1) || (*(int *)(lVar18 + 4) == 1)) goto LAB_003bcde2;
      pcVar19 = (char *)**(undefined8 **)(lVar18 + 8);
      pcVar20 = (char *)(*(undefined8 **)(lVar18 + 8))[1];
      uVar9 = Abc_NamStrFind(pNtk->pDesign->pMods,pcVar19);
      if (uVar9 == 0) {
        uVar9 = 1;
      }
      else {
        uVar9 = pNtk->pDesign->pNtks[uVar9].vOutputs.nCap;
      }
      iVar8 = *(int *)(lVar18 + 4);
      uVar10 = Abc_NamStrFind(pNtk->pDesign->pMods,pcVar19);
      if ((*(uint *)(lVar18 + 4) & 1) != 0) {
        __assert_fail("Vec_PtrSize(vBox) % 2 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x132,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (((int)uVar9 < 1) || ((int)*(uint *)(lVar18 + 4) < (int)(uVar9 * 2 + 2))) {
        __assert_fail("nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x133,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar11 = strcmp(pcVar19,"Const0T");
      if (iVar11 == 0) {
        Type = BAC_BOX_CF;
      }
      else {
        iVar11 = strcmp(pcVar19,"Const1T");
        if (iVar11 == 0) {
          Type = BAC_BOX_CT;
        }
        else {
          iVar11 = strcmp(pcVar19,"BufT");
          if (iVar11 == 0) {
            Type = BAC_BOX_BUF;
          }
          else {
            iVar11 = strcmp(pcVar19,"InvT");
            if (iVar11 == 0) {
              Type = BAC_BOX_INV;
            }
            else {
              iVar11 = strcmp(pcVar19,"AndT");
              if (iVar11 == 0) {
                Type = BAC_BOX_AND;
              }
              else {
                iVar11 = strcmp(pcVar19,"NandT");
                if (iVar11 == 0) {
                  Type = BAC_BOX_NAND;
                }
                else {
                  iVar11 = strcmp(pcVar19,"OrT");
                  if (iVar11 == 0) {
                    Type = BAC_BOX_OR;
                  }
                  else {
                    iVar11 = strcmp(pcVar19,"NorT");
                    if (iVar11 == 0) {
                      Type = BAC_BOX_NOR;
                    }
                    else {
                      iVar11 = strcmp(pcVar19,"XorT");
                      if (iVar11 == 0) {
                        Type = BAC_BOX_XOR;
                      }
                      else {
                        iVar11 = strcmp(pcVar19,"XnorT");
                        Type = BAC_OBJ_BOX;
                        if (iVar11 == 0) {
                          Type = BAC_BOX_XNOR;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar8 = iVar8 / 2;
      if (0 < (int)(~uVar9 + iVar8)) {
        iVar8 = iVar8 - uVar9;
        do {
          Bac_ObjAlloc(pNtk,BAC_OBJ_BI,-1);
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      i = Bac_ObjAlloc(pNtk,Type,uVar10);
      uVar17 = (ulong)i;
      uVar15 = uVar9;
      do {
        Bac_ObjAlloc(pNtk,BAC_OBJ_BO,-1);
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      if (0 < (int)uVar10) {
        pBVar6 = pNtk->pDesign;
        if (pBVar6->nNtks < (int)uVar10) {
          pBVar13 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar13 = pBVar6->pNtks + uVar10;
        }
        iVar8 = (int)((ulong)((long)pNtk - (long)pBVar6->pNtks) >> 4) * -0x3b13b13b;
        if ((iVar8 < 1) || (pBVar6->nNtks < iVar8)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (pBVar13->iBoxNtk != -1) {
          __assert_fail("p->iBoxNtk == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
        }
        pBVar13->iBoxNtk = iVar8;
        pBVar13->iBoxObj = i;
      }
      iVar8 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar20,(int *)0x0);
      iVar11 = Bac_ObjName(pNtk,i);
      if (iVar11 != 0) {
LAB_003bce3f:
        __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
      }
      if (((int)i < 0) || ((pNtk->vType).nSize <= (int)i)) {
LAB_003bcda4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (((pNtk->vType).pArray[uVar17] & 0xfcU) == 4) goto LAB_003bce3f;
      Vec_IntFillExtra(&pNtk->vName,i + 1,0);
      if ((pNtk->vName).nSize <= (int)i) goto LAB_003bcdc3;
      (pNtk->vName).pArray[uVar17] = iVar8 << 2;
      if ((int)(i + 1) < (pNtk->vType).nSize) {
        iVar8 = uVar9 * -2;
        do {
          iVar11 = (int)uVar17;
          if (iVar11 < -1) goto LAB_003bcda4;
          if (((pNtk->vType).pArray[uVar17 + 1] & 0xfeU) != 8) break;
          iVar12 = *(int *)(lVar18 + 4);
          if ((iVar8 + iVar12 < -1) || (uVar9 = iVar8 + iVar12 + 1, iVar12 <= (int)uVar9))
          goto LAB_003bcde2;
          pcVar19 = *(char **)(*(long *)(lVar18 + 8) + (ulong)uVar9 * 8);
          uVar9 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar19,(int *)0x0);
          Vec_IntFillExtra(vMap,uVar9 + 1,-1);
          if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) goto LAB_003bcd85;
          if (vMap->pArray[uVar9] != -1) {
            pcVar20 = "Signal \"%s\" has multiple drivers in module \"%s\".\n";
            goto LAB_003bcd68;
          }
          iVar12 = Bac_ObjName(pNtk,iVar11 + 1);
          if (iVar12 != 0) goto LAB_003bce3f;
          if ((pNtk->vType).nSize <= iVar11 + 1) goto LAB_003bcda4;
          if (((pNtk->vType).pArray[uVar17 + 1] & 0xfcU) == 4) goto LAB_003bce3f;
          Vec_IntFillExtra(&pNtk->vName,iVar11 + 2,0);
          if ((pNtk->vName).nSize <= iVar11 + 1) goto LAB_003bcdc3;
          (pNtk->vName).pArray[uVar17 + 1] = uVar9 * 4;
          Vec_IntFillExtra(vMap,uVar9 + 1,-1);
          if (vMap->nSize <= (int)uVar9) goto LAB_003bcdc3;
          uVar17 = uVar17 + 1;
          vMap->pArray[uVar9] = (int)uVar17;
          iVar8 = iVar8 + 2;
        } while (iVar11 + 2 < (pNtk->vType).nSize);
      }
      Vec_IntPush(vBox2Id,i);
      lVar21 = lVar21 + 1;
      iVar8 = *(int *)((long)pvVar5 + 4);
    } while (lVar21 < iVar8);
  }
  if (vBox2Id->nSize != iVar8) {
    __assert_fail("Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x143,
                  "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if (0 < *(int *)((long)pvVar5 + 4)) {
    lVar21 = 0;
    do {
      if (vBox2Id->nSize <= lVar21) goto LAB_003bcd85;
      lVar18 = (long)vBox2Id->pArray[lVar21];
      if (0 < lVar18) {
        lVar7 = *(long *)(*(long *)((long)pvVar5 + 8) + lVar21 * 8);
        lVar16 = 3;
        do {
          if ((pNtk->vType).nSize < lVar18) goto LAB_003bcda4;
          if (((pNtk->vType).pArray[lVar18 + -1] & 0xfeU) != 6) break;
          if (*(int *)(lVar7 + 4) <= (int)lVar16) goto LAB_003bcde2;
          pcVar19 = *(char **)(*(long *)(lVar7 + 8) + lVar16 * 8);
          uVar9 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar19,(int *)0x0);
          Vec_IntFillExtra(vMap,uVar9 + 1,-1);
          if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) goto LAB_003bcd85;
          if (vMap->pArray[uVar9] == -1) {
            printf("Signal \"%s\" in not driven in module \"%s\".\n",pcVar19,pcVar14);
          }
          Vec_IntFillExtra(vMap,uVar9 + 1,-1);
          if (vMap->nSize <= (int)uVar9) goto LAB_003bcd85;
          if ((pNtk->vType).nSize < lVar18) goto LAB_003bcda4;
          if (((pNtk->vType).pArray[lVar18 + -1] & 0xfcU) != 4) {
            pcVar20 = "Bac_ObjIsCo(p, i)";
            pcVar19 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h";
            pcVar14 = "int Bac_ObjFanin(Bac_Ntk_t *, int)";
            goto LAB_003bce35;
          }
          if ((pNtk->vFanin).nSize < lVar18) goto LAB_003bcd85;
          if ((pNtk->vFanin).pArray[lVar18 + -1] != -1) {
            __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                          ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
          }
          iVar8 = vMap->pArray[uVar9];
          Vec_IntFillExtra(&pNtk->vFanin,(int)lVar18,0);
          if ((pNtk->vFanin).nSize < lVar18) goto LAB_003bcdc3;
          (pNtk->vFanin).pArray[lVar18 + -1] = iVar8;
          lVar18 = lVar18 + -1;
          lVar16 = lVar16 + 2;
        } while (lVar18 != 0);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < *(int *)((long)pvVar5 + 4));
  }
  if (0 < *(int *)((long)pvVar4 + 4)) {
    pVVar1 = &pNtk->vInfo;
    lVar21 = 0;
    do {
      pcVar19 = *(char **)(*(long *)((long)pvVar4 + 8) + lVar21 * 8);
      uVar9 = Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs,pcVar19,(int *)0x0);
      Vec_IntFillExtra(vMap,uVar9 + 1,-1);
      if (((int)uVar9 < 0) || (vMap->nSize <= (int)uVar9)) {
LAB_003bcd85:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vMap->pArray[uVar9] == -1) {
        printf("PO with name \"%s\" in not driven in module \"%s\".\n",pcVar19,pcVar14);
      }
      Vec_IntFillExtra(vMap,uVar9 + 1,-1);
      if (vMap->nSize <= (int)uVar9) goto LAB_003bcd85;
      Bac_ObjAlloc(pNtk,BAC_OBJ_PO,vMap->pArray[uVar9]);
      Vec_IntPush(pVVar1,uVar9 * 4 + 2);
      Vec_IntPush(pVVar1,-1);
      Vec_IntPush(pVVar1,-1);
      lVar21 = lVar21 + 1;
    } while (lVar21 < *(int *)((long)pvVar4 + 4));
  }
  iVar8 = (pNtk->vType).nSize;
  if (0 < iVar8) {
    lVar21 = 0;
    do {
      uVar9 = (uint)(byte)(pNtk->vType).pArray[lVar21];
      if ((uVar9 < 10) && ((0x30cU >> (uVar9 & 0x1f) & 1) != 0)) {
        uVar9 = Bac_ObjName(pNtk,(int)lVar21);
        if ((int)uVar9 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x13d,"int Abc_Lit2Var2(int)");
        }
        uVar9 = uVar9 >> 2;
        Vec_IntFillExtra(vMap,uVar9 + 1,-1);
        if (vMap->nSize <= (int)uVar9) {
LAB_003bcdc3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar9] = -1;
      }
      lVar21 = lVar21 + 1;
      iVar8 = (pNtk->vType).nSize;
    } while (lVar21 < iVar8);
  }
  if (0 < (long)vMap->nSize) {
    lVar21 = 0;
    do {
      if (vMap->pArray[lVar21] != -1) {
        __assert_fail("iObj == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                      ,0x15f,
                      "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      lVar21 = lVar21 + 1;
    } while (vMap->nSize != lVar21);
  }
  if (iVar8 == (pNtk->vType).nCap) {
    return 1;
  }
  __assert_fail("Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x160,
                "int Bac_NtkDeriveFromPtr(Bac_Ntk_t *, Vec_Ptr_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Bac_NtkDeriveFromPtr( Bac_Ntk_t * pNtk, Vec_Ptr_t * vNtk, Vec_Int_t * vMap, Vec_Int_t * vBox2Id )
{
    char * pName, * pModuleName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4), * vBox;
    int i, k, iObj, iTerm, NameId;
    // start network with the given name
    NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pModuleName, NULL );
    assert( Bac_NtkNameId(pNtk) == NameId );
    // map driven NameIds into their ObjIds for PIs
    Vec_PtrForEachEntry( char *, vInputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
            { printf( "PI with name \"%s\" is not unique module \"%s\".\n", pName, pModuleName ); return 0; }
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntSetEntryFull( vMap, NameId, iObj );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 1), -1, -1 );
    }
    // map driven NameIds into their ObjIds for BOs
    Vec_IntClear( vBox2Id );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        char * pBoxNtk = (char *)Vec_PtrEntry(vBox, 0);
        char * pBoxName = (char *)Vec_PtrEntry(vBox, 1);
        int nOutputs = Bac_BoxCountOutputs( pNtk, pBoxNtk );
        int nInputs = Vec_PtrSize(vBox)/2 - nOutputs - 1;
        int NtkId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
        assert( Vec_PtrSize(vBox) % 2 == 0 );
        assert( nOutputs > 0 && 2*(nOutputs + 1) <= Vec_PtrSize(vBox) );
        iObj = Bac_BoxAlloc( pNtk, (Bac_ObjType_t)Ptr_NameToType(pBoxNtk), nInputs, nOutputs, NtkId );
        if ( NtkId > 0 )
            Bac_NtkSetHost( Bac_ManNtk(pNtk->pDesign, NtkId), Bac_NtkId(pNtk), iObj );
        Bac_ObjSetName( pNtk, iObj, Abc_Var2Lit2(Abc_NamStrFindOrAdd(pNtk->pDesign->pStrs, pBoxName, NULL), BAC_NAME_BIN) );
        Bac_BoxForEachBo( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, Vec_PtrSize(vBox) - 2*(nOutputs - k) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) != -1 )
                { printf( "Signal \"%s\" has multiple drivers in module \"%s\".\n", pName, pModuleName ); return 0; }
            Bac_ObjSetName( pNtk, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntSetEntryFull( vMap, NameId, iTerm );
        }
        Vec_IntPush( vBox2Id, iObj );
    }
    assert( Vec_IntSize(vBox2Id) == Vec_PtrSize(vBoxes) );
    // connect BIs
    Vec_PtrForEachEntry( Vec_Ptr_t *, vBoxes, vBox, i )
    {
        iObj = Vec_IntEntry( vBox2Id, i );
        Bac_BoxForEachBi( pNtk, iObj, iTerm, k )
        {
            pName = (char *)Vec_PtrEntry( vBox, 2*(k + 1) + 1 );
            NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
            if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
                printf( "Signal \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
            Bac_ObjSetFanin( pNtk, iTerm, Vec_IntGetEntryFull(vMap, NameId) );
        }
    }
    // connect POs
    Vec_PtrForEachEntry( char *, vOutputs, pName, i )
    {
        NameId = Abc_NamStrFindOrAdd( pNtk->pDesign->pStrs, pName, NULL );
        if ( Vec_IntGetEntryFull(vMap, NameId) == -1 )
            printf( "PO with name \"%s\" in not driven in module \"%s\".\n", pName, pModuleName );
        iObj = Bac_ObjAlloc( pNtk, BAC_OBJ_PO, Vec_IntGetEntryFull(vMap, NameId) );
        Bac_NtkAddInfo( pNtk, Abc_Var2Lit2(NameId, 2), -1, -1 );
    }
    // update map
    Bac_NtkForEachCi( pNtk, iObj )
        Vec_IntSetEntryFull( vMap, Bac_ObjNameId(pNtk, iObj), -1 );
    // double check
    Vec_IntForEachEntry( vMap, iObj, i )
        assert( iObj == -1 );
    assert( Bac_NtkObjNum(pNtk) == Vec_StrCap(&pNtk->vType) );
    return 1;
}